

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

void __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::AppendSegmentInternal
          (SegmentTree<duckdb::RowGroup,_true> *this,SegmentLock *l,
          unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *segment)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  reference pvVar2;
  pointer pRVar3;
  pointer pSVar4;
  pointer pSVar5;
  SegmentNode<duckdb::RowGroup> node;
  SegmentNode<duckdb::RowGroup> local_38;
  
  pSVar4 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = pSVar4;
  if (pSVar4 != (this->nodes).
                super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                .
                super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    _Var1._M_head_impl =
         (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
         super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    pvVar2 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::back(&this->nodes);
    pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       (&pvVar2->node);
    LOCK();
    (pRVar3->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = _Var1._M_head_impl;
    UNLOCK();
    pSVar4 = (this->nodes).
             super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->nodes).
             super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             .
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_38.node.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
       (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  (pRVar3->super_SegmentBase<duckdb::RowGroup>).index = (long)pSVar5 - (long)pSVar4 >> 4;
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  LOCK();
  (pRVar3->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (segment);
  local_38.row_start = (pRVar3->super_SegmentBase<duckdb::RowGroup>).start;
  ::std::__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::operator=
            ((__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
             &local_38.node,
             (__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)segment);
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,std::allocator<duckdb::SegmentNode<duckdb::RowGroup>>>
  ::emplace_back<duckdb::SegmentNode<duckdb::RowGroup>>
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,std::allocator<duckdb::SegmentNode<duckdb::RowGroup>>>
              *)&this->nodes,&local_38);
  ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
            (&local_38.node.
              super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>);
  return;
}

Assistant:

void AppendSegmentInternal(SegmentLock &l, unique_ptr<T> segment) {
		D_ASSERT(segment);
		// add the node to the list of nodes
		if (!nodes.empty()) {
			nodes.back().node->next = segment.get();
		}
		SegmentNode<T> node;
		segment->index = nodes.size();
		segment->next = nullptr;
		node.row_start = segment->start;
		node.node = std::move(segment);
		nodes.push_back(std::move(node));
	}